

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O2

Vec_Int_t * Vec_WecPushLevel(Vec_Wec_t *p)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nSize;
  if (iVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Vec_WecGrow(p,nCapMin);
    iVar1 = p->nSize;
  }
  p->nSize = iVar1 + 1U;
  if (-1 < iVar1) {
    return p->pArray + ((ulong)(iVar1 + 1U) - 1);
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
}

Assistant:

static inline Vec_Int_t * Vec_WecPushLevel( Vec_Wec_t * p )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WecGrow( p, 16 );
        else
            Vec_WecGrow( p, 2 * p->nCap );
    }
    ++p->nSize;
    return Vec_WecEntryLast( p );
}